

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O0

string * __thiscall
ApprovalTests::ApprovalMissingException::format(ApprovalMissingException *this,string *file)

{
  ostream *poVar1;
  string *in_RDX;
  string *in_RDI;
  stringstream s;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  string *local_18;
  
  local_18 = in_RDX;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = ::std::operator<<(local_190,"Failed Approval: \n");
  poVar1 = ::std::operator<<(poVar1,"Approval File Not Found \n");
  poVar1 = ::std::operator<<(poVar1,"File: \"");
  poVar1 = ::std::operator<<(poVar1,local_18);
  ::std::operator<<(poVar1,'\"');
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

std::string ApprovalMissingException::format(const std::string& file)
    {
        std::stringstream s;
        s << "Failed Approval: \n"
          << "Approval File Not Found \n"
          << "File: \"" << file << '"';
        return s.str();
    }